

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O0

float __thiscall
irr::io::CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase>::getAttributeValueAsFloat
          (CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase> *this,int idx)

{
  int iVar1;
  undefined4 extraout_var;
  char *__s;
  float local_204;
  locale local_200 [4];
  float fNum;
  locale local_1f8 [31];
  allocator<char> local_1d9;
  string local_1d8 [32];
  istringstream local_1b8 [8];
  istringstream sstr;
  undefined1 local_38 [8];
  stringc c;
  unsigned_short *attrvalue;
  int idx_local;
  CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase> *this_local;
  
  iVar1 = (*(this->super_IIrrXMLReader<unsigned_short,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                    (this,(ulong)(uint)idx);
  c._8_8_ = CONCAT44(extraout_var,iVar1);
  if ((unsigned_short *)c._8_8_ == (unsigned_short *)0x0) {
    this_local._4_4_ = 0.0;
  }
  else {
    core::string<char>::string<unsigned_short>((string<char> *)local_38,(unsigned_short *)c._8_8_);
    __s = core::string<char>::c_str((string<char> *)local_38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_1d8,__s,&local_1d9);
    std::__cxx11::istringstream::istringstream(local_1b8,local_1d8,_S_in);
    std::__cxx11::string::~string(local_1d8);
    std::allocator<char>::~allocator(&local_1d9);
    std::locale::locale(local_200,"C");
    std::ios::imbue(local_1f8);
    std::locale::~locale(local_1f8);
    std::locale::~locale(local_200);
    std::istream::operator>>(local_1b8,&local_204);
    this_local._4_4_ = local_204;
    std::__cxx11::istringstream::~istringstream(local_1b8);
    core::string<char>::~string((string<char> *)local_38);
  }
  return this_local._4_4_;
}

Assistant:

float getAttributeValueAsFloat(int idx) const
	{
		const char_type* attrvalue = getAttributeValue(idx);
		if (!attrvalue)
			return 0;

		core::stringc c = attrvalue;
		std::istringstream sstr(c.c_str());
		sstr.imbue(std::locale("C")); // Locale free number convert
		float fNum;
		sstr >> fNum;
		return fNum;
	}